

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue obj;
  JSValue val_00;
  long lVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  ulong uVar7;
  long idx;
  int64_t iVar8;
  int64_t iVar9;
  uint uVar10;
  bool bVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue prop;
  int64_t len;
  JSValue val;
  int64_t local_b0;
  JSValueUnion local_a0;
  int64_t local_78;
  long local_50;
  JSValueUnion local_48;
  int64_t iStack_40;
  
  JVar12 = JS_ToObject(ctx,this_val);
  JVar1 = JVar12;
  if ((int)JVar12.tag == 6) {
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
    uVar5 = 0;
  }
  else {
    JVar13 = JS_ArraySpeciesCreate(ctx,JVar12,(JSValue)ZEXT816(0));
    JVar4 = JVar13.u;
    uVar5 = (ulong)JVar4.ptr >> 0x20;
    if ((int)JVar13.tag != 6) {
      if (argc < 0) {
        uVar7 = 0;
      }
      else {
        uVar10 = 0xffffffff;
        uVar7 = 0;
        do {
          local_78 = JVar12.tag;
          local_a0 = JVar12.u;
          iVar8 = JVar1.tag;
          obj = JVar1;
          if (-1 < (int)uVar10) {
            obj.tag = argv[uVar10].tag;
            obj.u.ptr = argv[uVar10].u.ptr;
          }
          iVar3 = 0;
          if ((uint)obj.tag == 0xffffffff) {
            JVar14 = JS_GetPropertyInternal(ctx,obj,0xcd,obj,0);
            if ((int)JVar14.tag == 3) {
              iVar3 = JS_IsArray(ctx,obj);
            }
            else {
              iVar3 = -1;
              if ((int)JVar14.tag != 6) {
                iVar3 = JS_ToBoolFree(ctx,JVar14);
              }
            }
          }
          if (iVar3 < 0) goto LAB_001643cf;
          if (iVar3 == 0) {
            if (0x1ffffffffffffe < (long)uVar7) goto LAB_001643aa;
            if (0xfffffff4 < (uint)obj.tag) {
              *(int *)obj.u.ptr = *obj.u.ptr + 1;
            }
            bVar11 = (long)(int)uVar7 == uVar7;
            JVar6.float64 = (double)(long)uVar7;
            if (bVar11) {
              JVar6.ptr = (void *)(uVar7 & 0xffffffff);
            }
            iVar9 = 7;
            if (bVar11) {
              iVar9 = 0;
            }
            JVar14.tag = iVar9;
            JVar14.u.float64 = JVar6.float64;
            iVar3 = JS_DefinePropertyValueValue(ctx,JVar13,JVar14,obj,0x4007);
            JVar1.tag = iVar8;
            JVar1.u.ptr = local_a0.ptr;
            if (iVar3 < 0) goto LAB_001643cf;
            uVar7 = uVar7 + 1;
          }
          else {
            iVar3 = js_get_length64(ctx,&local_50,obj);
            lVar2 = local_50;
            if (iVar3 != 0) goto LAB_001643cf;
            if (0x1fffffffffffff < (long)(local_50 + uVar7)) {
LAB_001643aa:
              JS_ThrowTypeError(ctx,"Array loo long");
              local_78 = iVar8;
LAB_001643bb:
              JVar1.tag = local_78;
              JVar1.u.ptr = local_a0.ptr;
              goto LAB_001643cf;
            }
            if (0 < local_50) {
              idx = 0;
              do {
                iVar3 = JS_TryGetPropertyInt64(ctx,obj,idx,(JSValue *)&local_48);
                if (iVar3 < 0) goto LAB_001643bb;
                if (iVar3 != 0) {
                  JVar6.float64 = (double)(long)(uVar7 + idx);
                  if (uVar7 + 0x80000000 + idx >> 0x20 == 0) {
                    iVar8 = 0;
                    JVar6.ptr = (void *)(uVar7 + idx & 0xffffffff);
                  }
                  else {
                    iVar8 = 7;
                  }
                  val_00.tag = iStack_40;
                  val_00.u.float64 = local_48.float64;
                  prop.tag = iVar8;
                  prop.u.ptr = JVar6.ptr;
                  iVar3 = JS_DefinePropertyValueValue(ctx,JVar13,prop,val_00,0x4007);
                  if (iVar3 < 0) goto LAB_001643bb;
                }
                idx = idx + 1;
              } while (lVar2 != idx);
              uVar7 = uVar7 + idx;
              iVar8 = local_78;
            }
          }
          JVar1.tag = iVar8;
          JVar1.u.ptr = local_a0.ptr;
          uVar10 = uVar10 + 1;
        } while (uVar10 != argc);
      }
      bVar11 = (long)(int)uVar7 == uVar7;
      JVar6.float64 = (double)(long)uVar7;
      if (bVar11) {
        JVar6.ptr = (void *)(uVar7 & 0xffffffff);
      }
      iVar8 = 7;
      if (bVar11) {
        iVar8 = 0;
      }
      local_b0 = JVar13.tag;
      JVar12.tag = iVar8;
      JVar12.u.float64 = JVar6.float64;
      iVar3 = JS_SetPropertyInternal(ctx,JVar13,0x30,JVar12,0x4000);
      if (-1 < iVar3) {
        JS_FreeValue(ctx,JVar1);
        goto LAB_0016443d;
      }
    }
  }
LAB_001643cf:
  JVar4.ptr = (void *)((ulong)JVar13.u.ptr & 0xffffffff | uVar5 << 0x20);
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
    JVar13.tag = JVar13.tag;
    JVar13.u.ptr = JVar4.ptr;
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  if ((0xfffffff4 < (uint)JVar1.tag) &&
     (iVar3 = *JVar1.u.ptr, *(int *)JVar1.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar1);
  }
  local_b0 = 6;
  JVar4.float64 = 0.0;
LAB_0016443d:
  JVar15.tag = local_b0;
  JVar15.u.float64 = JVar4.float64;
  return JVar15;
}

Assistant:

static JSValue js_array_concat(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue obj, arr, val;
    JSValueConst e;
    int64_t len, k, n;
    int i, res;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;

    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    n = 0;
    for (i = -1; i < argc; i++) {
        if (i < 0)
            e = obj;
        else
            e = argv[i];

        res = JS_isConcatSpreadable(ctx, e);
        if (res < 0)
            goto exception;
        if (res) {
            if (js_get_length64(ctx, &len, e))
                goto exception;
            if (n + len > MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            for (k = 0; k < len; k++, n++) {
                res = JS_TryGetPropertyInt64(ctx, e, k, &val);
                if (res < 0)
                    goto exception;
                if (res) {
                    if (JS_DefinePropertyValueInt64(ctx, arr, n, val,
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
            }
        } else {
            if (n >= MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, arr, n, JS_DupValue(ctx, e),
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            n++;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}